

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

double orient3d(double *pa,double *pb,double *pc,double *pd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double errbound;
  double permanent;
  double det;
  double bdxady;
  double adxbdy;
  double adxcdy;
  double cdxady;
  double cdxbdy;
  double bdxcdy;
  double cdz;
  double bdz;
  double adz;
  double cdy;
  double bdy;
  double ady;
  double cdx;
  double bdx;
  double adx;
  double *pd_local;
  double *pc_local;
  double *pb_local;
  double *pa_local;
  
  dVar1 = (*pb - *pd) * (pc[1] - pd[1]);
  dVar2 = (*pc - *pd) * (pb[1] - pd[1]);
  dVar3 = (*pc - *pd) * (pa[1] - pd[1]);
  dVar4 = (*pa - *pd) * (pc[1] - pd[1]);
  dVar5 = (*pa - *pd) * (pb[1] - pd[1]);
  dVar6 = (*pb - *pd) * (pa[1] - pd[1]);
  pa_local = (double *)
             ((pc[2] - pd[2]) * (dVar5 - dVar6) +
             (pa[2] - pd[2]) * (dVar1 - dVar2) + (pb[2] - pd[2]) * (dVar3 - dVar4));
  if ((_use_inexact_arith == 0) &&
     ((_use_static_filter == 0 ||
      (((double)pa_local <= o3dstaticfilter && (-o3dstaticfilter <= (double)pa_local)))))) {
    dVar1 = (ABS(dVar5) + ABS(dVar6)) * ABS(pc[2] - pd[2]) +
            (ABS(dVar1) + ABS(dVar2)) * ABS(pa[2] - pd[2]) +
            (ABS(dVar3) + ABS(dVar4)) * ABS(pb[2] - pd[2]);
    dVar2 = o3derrboundA * dVar1;
    if (((double)pa_local <= dVar2) && (-(double)pa_local <= dVar2)) {
      pa_local = (double *)orient3dadapt(pa,pb,pc,pd,dVar1);
    }
  }
  return (double)pa_local;
}

Assistant:

REAL orient3d(REAL *pa, REAL *pb, REAL *pc, REAL *pd)
{
  REAL adx, bdx, cdx, ady, bdy, cdy, adz, bdz, cdz;
  REAL bdxcdy, cdxbdy, cdxady, adxcdy, adxbdy, bdxady;
  REAL det;


  adx = pa[0] - pd[0];
  ady = pa[1] - pd[1];
  adz = pa[2] - pd[2];
  bdx = pb[0] - pd[0];
  bdy = pb[1] - pd[1];
  bdz = pb[2] - pd[2];
  cdx = pc[0] - pd[0];
  cdy = pc[1] - pd[1];
  cdz = pc[2] - pd[2];

  bdxcdy = bdx * cdy;
  cdxbdy = cdx * bdy;

  cdxady = cdx * ady;
  adxcdy = adx * cdy;

  adxbdy = adx * bdy;
  bdxady = bdx * ady;

  det = adz * (bdxcdy - cdxbdy) 
      + bdz * (cdxady - adxcdy)
      + cdz * (adxbdy - bdxady);

  if (_use_inexact_arith) {
    return det;
  }

  if (_use_static_filter) {
    //if (fabs(det) > o3dstaticfilter) return det;
    if (det > o3dstaticfilter) return det;
    if (det < -o3dstaticfilter) return det;
  }


  REAL permanent, errbound;

  permanent = (Absolute(bdxcdy) + Absolute(cdxbdy)) * Absolute(adz)
            + (Absolute(cdxady) + Absolute(adxcdy)) * Absolute(bdz)
            + (Absolute(adxbdy) + Absolute(bdxady)) * Absolute(cdz);
  errbound = o3derrboundA * permanent;
  if ((det > errbound) || (-det > errbound)) {
    return det;
  }

  return orient3dadapt(pa, pb, pc, pd, permanent);
}